

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  undefined8 uVar1;
  BBox1f BVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  size_t sVar6;
  PrimRefMB *pPVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  undefined4 uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  size_t index;
  BufferView<embree::Vec3fa> *pBVar33;
  size_t *psVar34;
  ulong uVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar55;
  undefined1 auVar56 [64];
  float fVar61;
  float fVar62;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  undefined1 auVar58 [16];
  float fVar63;
  undefined1 auVar59 [16];
  float fVar68;
  float fVar69;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar64;
  undefined1 auVar65 [16];
  float fVar70;
  undefined1 auVar66 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar78;
  undefined1 auVar79 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar80;
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar84;
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  undefined1 auVar91 [16];
  float fVar94;
  unsigned_long local_118;
  size_t local_110;
  size_t local_100;
  ulong uVar16;
  undefined1 auVar60 [64];
  undefined1 auVar67 [64];
  undefined1 auVar73 [64];
  undefined1 auVar76 [64];
  
  aVar57.m128[2] = INFINITY;
  aVar57._0_8_ = 0x7f8000007f800000;
  aVar57.m128[3] = INFINITY;
  auVar60 = ZEXT1664((undefined1  [16])aVar57);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar57;
  aVar64.m128[2] = -INFINITY;
  aVar64._0_8_ = 0xff800000ff800000;
  aVar64.m128[3] = -INFINITY;
  auVar67 = ZEXT1664((undefined1  [16])aVar64);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar64;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar64;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar64;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = &DAT_3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar66);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar1;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar21 = r->_begin;
  auVar74._8_8_ = 0;
  auVar74._0_4_ = (__return_storage_ptr__->time_range).lower;
  auVar74._4_4_ = (__return_storage_ptr__->time_range).upper;
  auVar76 = ZEXT1664(auVar74);
  local_110 = __return_storage_ptr__->num_time_segments;
  uVar16 = __return_storage_ptr__->max_num_time_segments;
  auVar71._8_8_ = 0;
  auVar71._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar71._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar73 = ZEXT1664(auVar71);
  aVar84 = aVar57;
  aVar55 = aVar64;
  aVar80 = aVar57;
  aVar78 = aVar64;
  if (uVar21 < r->_end) {
    local_100 = k;
    local_118 = (__return_storage_ptr__->object_range)._end;
    auVar86._8_4_ = 0xddccb9a2;
    auVar86._0_8_ = 0xddccb9a2ddccb9a2;
    auVar86._12_4_ = 0xddccb9a2;
    auVar87._8_4_ = 0x5dccb9a2;
    auVar87._0_8_ = 0x5dccb9a25dccb9a2;
    auVar87._12_4_ = 0x5dccb9a2;
    auVar85 = ZEXT1664((undefined1  [16])aVar57);
    auVar56 = ZEXT1664((undefined1  [16])aVar64);
    auVar81 = ZEXT1664((undefined1  [16])aVar57);
    auVar79 = ZEXT1664((undefined1  [16])aVar64);
    do {
      BVar2 = (this->super_GridMesh).super_Geometry.time_range;
      auVar39._8_8_ = 0;
      auVar39._0_4_ = BVar2.lower;
      auVar39._4_4_ = BVar2.upper;
      fVar37 = BVar2.lower;
      auVar66 = vmovshdup_avx(auVar39);
      fVar12 = auVar66._0_4_ - fVar37;
      if (uVar21 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar5 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar22 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar30 = *(long *)&(this->super_GridMesh).field_0x68 * uVar21;
        uVar18 = *(uint *)(lVar5 + lVar30);
        if (uVar18 < uVar22) {
          uVar3 = *(ushort *)(lVar5 + 10 + lVar30);
          uVar17 = (ulong)uVar3;
          uVar28 = *(uint *)(lVar5 + 4 + lVar30);
          uVar4 = *(ushort *)(lVar5 + 8 + lVar30);
          if (((uint)uVar4 + uVar28 * (uVar3 - 1) + uVar18) - 1 < uVar22) {
            bVar36 = uVar17 != 0;
            if (bVar36) {
              fVar41 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
              auVar66 = ZEXT416((uint)(fVar41 * ((t0t1->lower - fVar37) / fVar12) * 1.0000002));
              auVar66 = vroundss_avx(auVar66,auVar66,9);
              auVar66 = vmaxss_avx(ZEXT816(0),auVar66);
              uVar29 = (uint)auVar66._0_4_;
              auVar66 = ZEXT416((uint)(fVar41 * ((t0t1->upper - fVar37) / fVar12) * 0.99999976));
              auVar66 = vroundss_avx(auVar66,auVar66,10);
              auVar66 = vminss_avx(auVar66,ZEXT416((uint)fVar41));
              uVar22 = 0;
              do {
                if (uVar4 != 0) {
                  uVar35 = 0;
                  do {
                    if (uVar29 <= (uint)(int)auVar66._0_4_) {
                      uVar24 = (long)(int)uVar29;
                      psVar34 = &(this->super_GridMesh).vertices.items[(int)uVar29].
                                 super_RawBufferView.stride;
                      do {
                        auVar71 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar34 + -2))->ptr_ofs +
                                              *psVar34 * (uVar22 * uVar28 + (ulong)uVar18 + uVar35))
                                             ,auVar86,6);
                        auVar74 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar34 + -2))->ptr_ofs +
                                              *psVar34 * (uVar22 * uVar28 + (ulong)uVar18 + uVar35))
                                             ,auVar87,1);
                        auVar71 = vandps_avx(auVar71,auVar74);
                        uVar26 = vmovmskps_avx(auVar71);
                        if ((~(byte)uVar26 & 7) != 0) {
                          if (bVar36) goto LAB_01328254;
                          goto LAB_0132823a;
                        }
                        uVar24 = uVar24 + 1;
                        psVar34 = psVar34 + 7;
                      } while (uVar24 <= (ulong)(long)(int)auVar66._0_4_);
                    }
                    uVar35 = uVar35 + 1;
                  } while (uVar35 != uVar4);
                }
                uVar22 = uVar22 + 1;
                bVar36 = uVar22 < uVar17;
              } while (uVar22 != uVar17);
            }
LAB_0132823a:
            lVar5 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
            lVar30 = *(long *)&(this->super_GridMesh).field_0x68 * uVar21;
            if (*(short *)(lVar5 + 10 + lVar30) != 1) {
              uVar18 = 0;
              do {
                uVar3 = *(ushort *)(lVar5 + 8 + lVar30);
                uVar28 = (uint)uVar3;
                if (uVar3 != 1) {
                  uVar17 = (ulong)uVar18;
                  uVar35 = 0;
                  uVar22 = uVar16;
                  do {
                    fVar12 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
                    fVar37 = (this->super_GridMesh).super_Geometry.time_range.lower;
                    fVar38 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar37;
                    fVar43 = (t0t1->lower - fVar37) / fVar38;
                    fVar38 = (t0t1->upper - fVar37) / fVar38;
                    fVar37 = fVar12 * fVar43;
                    fVar41 = fVar12 * fVar38;
                    auVar71 = vroundss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),9);
                    auVar66 = vmaxss_avx(auVar71,ZEXT416(0));
                    iVar13 = (int)auVar66._0_4_;
                    auVar74 = vroundss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),10);
                    iVar19 = (int)auVar71._0_4_;
                    if (iVar19 < 0) {
                      iVar19 = -1;
                    }
                    uVar16 = uVar35 + 3;
                    iVar20 = (int)fVar12 + 1;
                    if ((int)auVar74._0_4_ < (int)fVar12 + 1) {
                      iVar20 = (int)auVar74._0_4_;
                    }
                    uVar3 = *(ushort *)(lVar5 + 10 + lVar30);
                    uVar27 = (ulong)uVar3;
                    uVar24 = uVar27;
                    if (uVar17 + 3 < uVar27) {
                      uVar24 = uVar17 + 3;
                    }
                    uVar31 = (ulong)uVar28;
                    auVar91._8_4_ = 0x7f800000;
                    auVar91._0_8_ = 0x7f8000007f800000;
                    auVar91._12_4_ = 0x7f800000;
                    auVar82._8_4_ = 0xff800000;
                    auVar82._0_8_ = 0xff800000ff800000;
                    auVar82._12_4_ = 0xff800000;
                    uVar29 = (uint)uVar35;
                    auVar71 = auVar82;
                    if (uVar17 < uVar27) {
                      pBVar33 = (this->super_GridMesh).vertices.items + iVar13;
                      uVar27 = uVar31;
                      if (uVar16 < uVar31) {
                        uVar27 = uVar16;
                      }
                      bVar36 = true;
                      auVar46 = ZEXT1664(auVar82);
                      auVar51 = ZEXT1664(CONCAT412(0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)));
                      uVar25 = uVar17;
                      do {
                        if (uVar29 < uVar28) {
                          sVar6 = (pBVar33->super_RawBufferView).stride;
                          pauVar23 = (undefined1 (*) [16])
                                     ((pBVar33->super_RawBufferView).ptr_ofs +
                                     (*(uint *)(lVar5 + lVar30) + uVar35 +
                                     *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                          lVar32 = uVar27 - uVar35;
                          do {
                            auVar71 = *pauVar23;
                            auVar39 = vcmpps_avx(auVar71,auVar86,6);
                            auVar91 = vcmpps_avx(auVar71,auVar87,1);
                            auVar39 = vandps_avx(auVar39,auVar91);
                            uVar26 = vmovmskps_avx(auVar39);
                            if ((~(byte)uVar26 & 7) != 0) {
                              auVar91._8_4_ = 0x7f800000;
                              auVar91._0_8_ = 0x7f8000007f800000;
                              auVar91._12_4_ = 0x7f800000;
                              auVar71 = auVar82;
                              if (!bVar36) {
                                auVar91 = auVar51._0_16_;
                                auVar71 = auVar46._0_16_;
                              }
                              goto LAB_0132847a;
                            }
                            auVar39 = vminps_avx(auVar51._0_16_,auVar71);
                            auVar51 = ZEXT1664(auVar39);
                            auVar71 = vmaxps_avx(auVar46._0_16_,auVar71);
                            auVar46 = ZEXT1664(auVar71);
                            pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                        uVar25 = uVar25 + 1;
                        bVar36 = uVar25 < uVar24;
                        auVar91 = auVar51._0_16_;
                        auVar71 = auVar46._0_16_;
                      } while (uVar25 != uVar24);
                    }
LAB_0132847a:
                    auVar39 = auVar76._0_16_;
                    auVar74 = vminss_avx(auVar74,ZEXT416((uint)fVar12));
                    fVar42 = auVar74._0_4_;
                    iVar14 = (int)fVar42;
                    auVar44._8_4_ = 0x7f800000;
                    auVar44._0_8_ = 0x7f8000007f800000;
                    auVar44._12_4_ = 0x7f800000;
                    auVar74 = auVar82;
                    if (uVar18 < uVar3) {
                      pBVar33 = (this->super_GridMesh).vertices.items + iVar14;
                      uVar27 = uVar31;
                      if (uVar16 < uVar31) {
                        uVar27 = uVar16;
                      }
                      bVar36 = true;
                      auVar76 = ZEXT1664(auVar82);
                      auVar46 = ZEXT1664(CONCAT412(0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)));
                      uVar25 = uVar17;
                      do {
                        if (uVar29 < uVar28) {
                          sVar6 = (pBVar33->super_RawBufferView).stride;
                          pauVar23 = (undefined1 (*) [16])
                                     ((pBVar33->super_RawBufferView).ptr_ofs +
                                     (*(uint *)(lVar5 + lVar30) + uVar35 +
                                     *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                          lVar32 = uVar27 - uVar35;
                          do {
                            auVar74 = *pauVar23;
                            auVar44 = vcmpps_avx(auVar74,auVar86,6);
                            auVar54 = vcmpps_avx(auVar74,auVar87,1);
                            auVar44 = vandps_avx(auVar44,auVar54);
                            uVar26 = vmovmskps_avx(auVar44);
                            if ((~(byte)uVar26 & 7) != 0) {
                              auVar44._8_4_ = 0x7f800000;
                              auVar44._0_8_ = 0x7f8000007f800000;
                              auVar44._12_4_ = 0x7f800000;
                              auVar74 = auVar82;
                              if (!bVar36) {
                                auVar44 = auVar46._0_16_;
                                auVar74 = auVar76._0_16_;
                              }
                              goto LAB_01328552;
                            }
                            auVar44 = vminps_avx(auVar46._0_16_,auVar74);
                            auVar46 = ZEXT1664(auVar44);
                            auVar74 = vmaxps_avx(auVar76._0_16_,auVar74);
                            auVar76 = ZEXT1664(auVar74);
                            pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                        uVar25 = uVar25 + 1;
                        bVar36 = uVar25 < uVar24;
                        auVar44 = auVar46._0_16_;
                        auVar74 = auVar76._0_16_;
                      } while (uVar25 != uVar24);
                    }
LAB_01328552:
                    auVar66 = ZEXT416((uint)(fVar37 - auVar66._0_4_));
                    fVar90 = auVar91._0_4_;
                    fVar92 = auVar91._4_4_;
                    fVar93 = auVar91._8_4_;
                    fVar94 = auVar91._12_4_;
                    fVar69 = auVar71._0_4_;
                    fVar70 = auVar71._4_4_;
                    fVar88 = auVar71._8_4_;
                    fVar89 = auVar71._12_4_;
                    fVar49 = auVar44._4_4_;
                    fVar62 = auVar44._8_4_;
                    fVar68 = auVar44._12_4_;
                    fVar48 = auVar74._4_4_;
                    fVar61 = auVar74._8_4_;
                    fVar63 = auVar74._12_4_;
                    fVar47 = auVar44._0_4_;
                    fVar37 = auVar74._0_4_;
                    if (iVar20 - iVar19 == 1) {
                      auVar66 = vmaxss_avx(auVar66,ZEXT816(0) << 0x40);
                      auVar71 = vshufps_avx(auVar66,auVar66,0);
                      auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
                      auVar66 = vshufps_avx(auVar66,auVar66,0);
                      auVar65._0_4_ = fVar90 * auVar66._0_4_ + auVar71._0_4_ * fVar47;
                      auVar65._4_4_ = fVar92 * auVar66._4_4_ + auVar71._4_4_ * fVar49;
                      auVar65._8_4_ = fVar93 * auVar66._8_4_ + auVar71._8_4_ * fVar62;
                      auVar65._12_4_ = fVar94 * auVar66._12_4_ + auVar71._12_4_ * fVar68;
                      auVar58._0_4_ = fVar69 * auVar66._0_4_ + auVar71._0_4_ * fVar37;
                      auVar58._4_4_ = fVar70 * auVar66._4_4_ + auVar71._4_4_ * fVar48;
                      auVar58._8_4_ = fVar88 * auVar66._8_4_ + auVar71._8_4_ * fVar61;
                      auVar58._12_4_ = fVar89 * auVar66._12_4_ + auVar71._12_4_ * fVar63;
                      auVar66 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar41)),ZEXT816(0) << 0x40);
                      auVar71 = vshufps_avx(auVar66,auVar66,0);
                      auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
                      auVar66 = vshufps_avx(auVar66,auVar66,0);
                      auVar45._0_4_ = fVar90 * auVar71._0_4_ + auVar66._0_4_ * fVar47;
                      auVar45._4_4_ = fVar92 * auVar71._4_4_ + auVar66._4_4_ * fVar49;
                      auVar45._8_4_ = fVar93 * auVar71._8_4_ + auVar66._8_4_ * fVar62;
                      auVar45._12_4_ = fVar94 * auVar71._12_4_ + auVar66._12_4_ * fVar68;
                      auVar40._0_4_ = fVar69 * auVar71._0_4_ + auVar66._0_4_ * fVar37;
                      auVar40._4_4_ = fVar70 * auVar71._4_4_ + auVar66._4_4_ * fVar48;
                      auVar40._8_4_ = fVar88 * auVar71._8_4_ + auVar66._8_4_ * fVar61;
                      auVar40._12_4_ = fVar89 * auVar71._12_4_ + auVar66._12_4_ * fVar63;
                    }
                    else {
                      auVar54._8_4_ = 0x7f800000;
                      auVar54._0_8_ = 0x7f8000007f800000;
                      auVar54._12_4_ = 0x7f800000;
                      auVar71 = auVar82;
                      if (uVar18 < uVar3) {
                        pBVar33 = (this->super_GridMesh).vertices.items;
                        uVar27 = uVar31;
                        if (uVar16 < uVar31) {
                          uVar27 = uVar16;
                        }
                        bVar36 = true;
                        auVar76 = ZEXT1664(auVar82);
                        auVar46 = ZEXT1664(CONCAT412(0x7f800000,
                                                     CONCAT48(0x7f800000,0x7f8000007f800000)));
                        uVar25 = uVar17;
                        do {
                          if (uVar29 < uVar28) {
                            sVar6 = pBVar33[(long)iVar13 + 1].super_RawBufferView.stride;
                            pauVar23 = (undefined1 (*) [16])
                                       (pBVar33[(long)iVar13 + 1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar30) + uVar35 +
                                       *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                            lVar32 = uVar27 - uVar35;
                            do {
                              auVar71 = *pauVar23;
                              auVar74 = vcmpps_avx(auVar71,auVar86,6);
                              auVar91 = vcmpps_avx(auVar71,auVar87,1);
                              auVar74 = vandps_avx(auVar91,auVar74);
                              uVar26 = vmovmskps_avx(auVar74);
                              if ((~(byte)uVar26 & 7) != 0) {
                                auVar54._8_4_ = 0x7f800000;
                                auVar54._0_8_ = 0x7f8000007f800000;
                                auVar54._12_4_ = 0x7f800000;
                                auVar71 = auVar82;
                                if (!bVar36) {
                                  auVar54 = auVar46._0_16_;
                                  auVar71 = auVar76._0_16_;
                                }
                                goto LAB_0132868b;
                              }
                              auVar74 = vminps_avx(auVar46._0_16_,auVar71);
                              auVar46 = ZEXT1664(auVar74);
                              auVar71 = vmaxps_avx(auVar76._0_16_,auVar71);
                              auVar76 = ZEXT1664(auVar71);
                              pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                              lVar32 = lVar32 + -1;
                            } while (lVar32 != 0);
                          }
                          uVar25 = uVar25 + 1;
                          bVar36 = uVar25 < uVar24;
                          auVar54 = auVar46._0_16_;
                          auVar71 = auVar76._0_16_;
                        } while (uVar25 != uVar24);
                      }
LAB_0132868b:
                      auVar75._8_4_ = 0x7f800000;
                      auVar75._0_8_ = 0x7f8000007f800000;
                      auVar75._12_4_ = 0x7f800000;
                      auVar74 = auVar82;
                      if (uVar18 < uVar3) {
                        pBVar33 = (this->super_GridMesh).vertices.items;
                        uVar27 = uVar31;
                        if (uVar16 < uVar31) {
                          uVar27 = uVar16;
                        }
                        bVar36 = true;
                        auVar76 = ZEXT1664(auVar82);
                        auVar46 = ZEXT1664(CONCAT412(0x7f800000,
                                                     CONCAT48(0x7f800000,0x7f8000007f800000)));
                        uVar25 = uVar17;
                        do {
                          if (uVar29 < uVar28) {
                            sVar6 = pBVar33[(long)iVar14 + -1].super_RawBufferView.stride;
                            pauVar23 = (undefined1 (*) [16])
                                       (pBVar33[(long)iVar14 + -1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar30) + uVar35 +
                                       *(uint *)(lVar5 + 4 + lVar30) * uVar25) * sVar6);
                            lVar32 = uVar27 - uVar35;
                            do {
                              auVar74 = *pauVar23;
                              auVar91 = vcmpps_avx(auVar74,auVar86,6);
                              auVar44 = vcmpps_avx(auVar74,auVar87,1);
                              auVar91 = vandps_avx(auVar91,auVar44);
                              uVar26 = vmovmskps_avx(auVar91);
                              if ((~(byte)uVar26 & 7) != 0) {
                                auVar75._8_4_ = 0x7f800000;
                                auVar75._0_8_ = 0x7f8000007f800000;
                                auVar75._12_4_ = 0x7f800000;
                                auVar74 = auVar82;
                                if (!bVar36) {
                                  auVar75 = auVar46._0_16_;
                                  auVar74 = auVar76._0_16_;
                                }
                                goto LAB_01328751;
                              }
                              auVar91 = vminps_avx(auVar46._0_16_,auVar74);
                              auVar46 = ZEXT1664(auVar91);
                              auVar74 = vmaxps_avx(auVar76._0_16_,auVar74);
                              auVar76 = ZEXT1664(auVar74);
                              pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                              lVar32 = lVar32 + -1;
                            } while (lVar32 != 0);
                          }
                          uVar25 = uVar25 + 1;
                          bVar36 = uVar25 < uVar24;
                          auVar75 = auVar46._0_16_;
                          auVar74 = auVar76._0_16_;
                        } while (uVar25 != uVar24);
                      }
LAB_01328751:
                      auVar66 = vmaxss_avx(auVar66,ZEXT816(0));
                      auVar91 = vshufps_avx(auVar66,auVar66,0);
                      auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
                      auVar66 = vshufps_avx(auVar66,auVar66,0);
                      auVar65._0_4_ = fVar90 * auVar66._0_4_ + auVar91._0_4_ * auVar54._0_4_;
                      auVar65._4_4_ = fVar92 * auVar66._4_4_ + auVar91._4_4_ * auVar54._4_4_;
                      auVar65._8_4_ = fVar93 * auVar66._8_4_ + auVar91._8_4_ * auVar54._8_4_;
                      auVar65._12_4_ = fVar94 * auVar66._12_4_ + auVar91._12_4_ * auVar54._12_4_;
                      auVar58._0_4_ = fVar69 * auVar66._0_4_ + auVar91._0_4_ * auVar71._0_4_;
                      auVar58._4_4_ = fVar70 * auVar66._4_4_ + auVar91._4_4_ * auVar71._4_4_;
                      auVar58._8_4_ = fVar88 * auVar66._8_4_ + auVar91._8_4_ * auVar71._8_4_;
                      auVar58._12_4_ = fVar89 * auVar66._12_4_ + auVar91._12_4_ * auVar71._12_4_;
                      auVar66 = vmaxss_avx(ZEXT416((uint)(fVar42 - fVar41)),ZEXT816(0));
                      auVar71 = vshufps_avx(auVar66,auVar66,0);
                      auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
                      auVar66 = vshufps_avx(auVar66,auVar66,0);
                      auVar45._0_4_ = auVar66._0_4_ * fVar47 + auVar75._0_4_ * auVar71._0_4_;
                      auVar45._4_4_ = auVar66._4_4_ * fVar49 + auVar75._4_4_ * auVar71._4_4_;
                      auVar45._8_4_ = auVar66._8_4_ * fVar62 + auVar75._8_4_ * auVar71._8_4_;
                      auVar45._12_4_ = auVar66._12_4_ * fVar68 + auVar75._12_4_ * auVar71._12_4_;
                      auVar40._0_4_ = auVar66._0_4_ * fVar37 + auVar74._0_4_ * auVar71._0_4_;
                      auVar40._4_4_ = auVar66._4_4_ * fVar48 + auVar74._4_4_ * auVar71._4_4_;
                      auVar40._8_4_ = auVar66._8_4_ * fVar61 + auVar74._8_4_ * auVar71._8_4_;
                      auVar40._12_4_ = auVar66._12_4_ * fVar63 + auVar74._12_4_ * auVar71._12_4_;
                      if ((int)(iVar19 + 1U) < iVar20) {
                        uVar27 = (ulong)(iVar19 + 1U);
                        if (uVar31 <= uVar16) {
                          uVar16 = uVar31;
                        }
                        auVar83._8_4_ = 0xff800000;
                        auVar83._0_8_ = 0xff800000ff800000;
                        auVar83._12_4_ = 0xff800000;
                        do {
                          auVar72._8_4_ = 0x7f800000;
                          auVar72._0_8_ = 0x7f8000007f800000;
                          auVar72._12_4_ = 0x7f800000;
                          auVar66 = auVar83;
                          if (uVar18 < uVar3) {
                            pBVar33 = (this->super_GridMesh).vertices.items + uVar27;
                            bVar36 = true;
                            auVar76 = ZEXT1664(auVar83);
                            auVar46 = ZEXT1664(CONCAT412(0x7f800000,
                                                         CONCAT48(0x7f800000,0x7f8000007f800000)));
                            uVar31 = uVar17;
                            do {
                              if (uVar29 < uVar28) {
                                sVar6 = (pBVar33->super_RawBufferView).stride;
                                pauVar23 = (undefined1 (*) [16])
                                           ((pBVar33->super_RawBufferView).ptr_ofs +
                                           (*(uint *)(lVar5 + lVar30) + uVar35 +
                                           *(uint *)(lVar5 + 4 + lVar30) * uVar31) * sVar6);
                                lVar32 = uVar16 - uVar35;
                                do {
                                  auVar66 = *pauVar23;
                                  auVar71 = vcmpps_avx(auVar66,auVar86,6);
                                  auVar74 = vcmpps_avx(auVar66,auVar87,1);
                                  auVar71 = vandps_avx(auVar71,auVar74);
                                  uVar26 = vmovmskps_avx(auVar71);
                                  if ((~(byte)uVar26 & 7) != 0) {
                                    auVar72._8_4_ = 0x7f800000;
                                    auVar72._0_8_ = 0x7f8000007f800000;
                                    auVar72._12_4_ = 0x7f800000;
                                    auVar66 = auVar83;
                                    if (!bVar36) {
                                      auVar72 = auVar46._0_16_;
                                      auVar66 = auVar76._0_16_;
                                    }
                                    goto LAB_013288a8;
                                  }
                                  auVar71 = vminps_avx(auVar46._0_16_,auVar66);
                                  auVar46 = ZEXT1664(auVar71);
                                  auVar66 = vmaxps_avx(auVar76._0_16_,auVar66);
                                  auVar76 = ZEXT1664(auVar66);
                                  pauVar23 = (undefined1 (*) [16])(*pauVar23 + sVar6);
                                  lVar32 = lVar32 + -1;
                                } while (lVar32 != 0);
                              }
                              uVar31 = uVar31 + 1;
                              bVar36 = uVar31 < uVar24;
                              auVar72 = auVar46._0_16_;
                              auVar66 = auVar76._0_16_;
                            } while (uVar31 != uVar24);
                          }
LAB_013288a8:
                          auVar52._0_4_ = ((float)(int)uVar27 / fVar12 - fVar43) / (fVar38 - fVar43)
                          ;
                          auVar52._4_12_ = SUB6012((undefined1  [60])0x0,0);
                          auVar71 = vshufps_avx(auVar52,auVar52,0);
                          fVar47 = auVar45._4_4_;
                          fVar48 = auVar45._8_4_;
                          fVar49 = auVar45._12_4_;
                          auVar74 = vshufps_avx(ZEXT416((uint)(1.0 - auVar52._0_4_)),
                                                ZEXT416((uint)(1.0 - auVar52._0_4_)),0);
                          fVar68 = auVar65._4_4_;
                          fVar69 = auVar65._8_4_;
                          fVar70 = auVar65._12_4_;
                          auVar77._0_4_ =
                               auVar45._0_4_ * auVar71._0_4_ + auVar65._0_4_ * auVar74._0_4_;
                          auVar77._4_4_ = fVar47 * auVar71._4_4_ + fVar68 * auVar74._4_4_;
                          auVar77._8_4_ = fVar48 * auVar71._8_4_ + fVar69 * auVar74._8_4_;
                          auVar77._12_4_ = fVar49 * auVar71._12_4_ + fVar70 * auVar74._12_4_;
                          auVar91 = vsubps_avx(auVar72,auVar77);
                          fVar37 = auVar40._4_4_;
                          fVar41 = auVar40._8_4_;
                          fVar42 = auVar40._12_4_;
                          fVar61 = auVar58._4_4_;
                          fVar62 = auVar58._8_4_;
                          fVar63 = auVar58._12_4_;
                          auVar53._0_4_ =
                               auVar40._0_4_ * auVar71._0_4_ + auVar58._0_4_ * auVar74._0_4_;
                          auVar53._4_4_ = fVar37 * auVar71._4_4_ + fVar61 * auVar74._4_4_;
                          auVar53._8_4_ = fVar41 * auVar71._8_4_ + fVar62 * auVar74._8_4_;
                          auVar53._12_4_ = fVar42 * auVar71._12_4_ + fVar63 * auVar74._12_4_;
                          auVar66 = vsubps_avx(auVar66,auVar53);
                          auVar71 = vminps_avx(auVar91,ZEXT816(0) << 0x40);
                          auVar66 = vmaxps_avx(auVar66,ZEXT816(0) << 0x40);
                          auVar65._0_4_ = auVar65._0_4_ + auVar71._0_4_;
                          auVar65._4_4_ = fVar68 + auVar71._4_4_;
                          auVar65._8_4_ = fVar69 + auVar71._8_4_;
                          auVar65._12_4_ = fVar70 + auVar71._12_4_;
                          auVar45._0_4_ = auVar45._0_4_ + auVar71._0_4_;
                          auVar45._4_4_ = fVar47 + auVar71._4_4_;
                          auVar45._8_4_ = fVar48 + auVar71._8_4_;
                          auVar45._12_4_ = fVar49 + auVar71._12_4_;
                          auVar58._0_4_ = auVar58._0_4_ + auVar66._0_4_;
                          auVar58._4_4_ = fVar61 + auVar66._4_4_;
                          auVar58._8_4_ = fVar62 + auVar66._8_4_;
                          auVar58._12_4_ = fVar63 + auVar66._12_4_;
                          auVar40._0_4_ = auVar40._0_4_ + auVar66._0_4_;
                          auVar40._4_4_ = fVar37 + auVar66._4_4_;
                          auVar40._8_4_ = fVar41 + auVar66._8_4_;
                          auVar40._12_4_ = fVar42 + auVar66._12_4_;
                          uVar27 = uVar27 + 1;
                        } while (iVar20 != (int)uVar27);
                      }
                    }
                    aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                            vinsertps_avx(auVar65,ZEXT416(geomID),0x30);
                    uVar15 = (this->super_GridMesh).super_Geometry.numTimeSteps - 1;
                    uVar16 = (ulong)uVar15;
                    BVar2 = (this->super_GridMesh).super_Geometry.time_range;
                    auVar50._8_8_ = 0;
                    auVar50._0_4_ = BVar2.lower;
                    auVar50._4_4_ = BVar2.upper;
                    aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                            vinsertps_avx(auVar58,ZEXT416((uint)local_100),0x30);
                    aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                             vinsertps_avx(auVar45,ZEXT416(uVar15),0x30);
                    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                             vinsertps_avx(auVar40,ZEXT416(uVar15),0x30);
                    auVar71 = vcmpps_avx(auVar39,auVar50,1);
                    auVar74 = vinsertps_avx(auVar39,auVar50,0x50);
                    auVar66 = vblendps_avx(auVar50,auVar39,2);
                    auVar66 = vblendvps_avx(auVar66,auVar74,auVar71);
                    auVar76 = ZEXT1664(auVar66);
                    auVar59._0_4_ = aVar8.x * 0.5 + aVar10.x * 0.5 + aVar9.x * 0.5 + aVar11.x * 0.5;
                    auVar59._4_4_ = aVar8.y * 0.5 + aVar10.y * 0.5 + aVar9.y * 0.5 + aVar11.y * 0.5;
                    auVar59._8_4_ = aVar8.z * 0.5 + aVar10.z * 0.5 + aVar9.z * 0.5 + aVar11.z * 0.5;
                    auVar59._12_4_ =
                         aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5 +
                         aVar9.field_3.w * 0.5 + aVar11.field_3.w * 0.5;
                    local_118 = local_118 + 1;
                    local_110 = local_110 + uVar16;
                    auVar66 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar24 >> 8),uVar22 < uVar16
                                                                )),0x50);
                    auVar66 = vpslld_avx(auVar66,0x1f);
                    auVar66 = vblendvps_avx(auVar73._0_16_,auVar50,auVar66);
                    auVar73 = ZEXT1664(auVar66);
                    auVar66 = vminps_avx(auVar81._0_16_,auVar59);
                    auVar81 = ZEXT1664(auVar66);
                    auVar66 = vmaxps_avx(auVar79._0_16_,auVar59);
                    auVar79 = ZEXT1664(auVar66);
                    if (uVar16 < uVar22) {
                      uVar16 = uVar22;
                    }
                    auVar66 = vminps_avx(auVar60._0_16_,(undefined1  [16])aVar8);
                    auVar60 = ZEXT1664(auVar66);
                    uVar15 = uVar29 + 2;
                    uVar35 = (ulong)uVar15;
                    sgrids->items[local_100] =
                         (SubGridBuildData)
                         ((ulong)(uVar29 & 0xfffe | (uint)(uVar28 <= uVar15) << 0xf) |
                         (ulong)(uVar18 << 0x10 | (uint)((uint)uVar3 <= uVar18 + 2) << 0x1f) |
                         uVar21 << 0x20);
                    pPVar7 = prims->items;
                    pPVar7[local_100].lbounds.bounds0.lower.field_0.field_1 = aVar8;
                    auVar66 = vmaxps_avx(auVar67._0_16_,(undefined1  [16])aVar9);
                    auVar67 = ZEXT1664(auVar66);
                    pPVar7[local_100].lbounds.bounds0.upper.field_0.field_1 = aVar9;
                    auVar66 = vminps_avx(auVar85._0_16_,(undefined1  [16])aVar10);
                    auVar85 = ZEXT1664(auVar66);
                    pPVar7[local_100].lbounds.bounds1.lower.field_0.field_1 = aVar10;
                    auVar66 = vmaxps_avx(auVar56._0_16_,(undefined1  [16])aVar11);
                    auVar56 = ZEXT1664(auVar66);
                    pPVar7[local_100].lbounds.bounds1.upper.field_0.field_1 = aVar11;
                    pPVar7[local_100].time_range = BVar2;
                    local_100 = local_100 + 1;
                    uVar28 = (uint)*(ushort *)(lVar5 + 8 + lVar30);
                    uVar22 = uVar16;
                  } while (uVar15 < uVar28 - 1);
                }
                uVar18 = uVar18 + 2;
              } while (uVar18 < *(ushort *)(lVar5 + 10 + lVar30) - 1);
            }
          }
        }
      }
LAB_01328254:
      aVar64 = auVar67._0_16_;
      aVar57 = auVar60._0_16_;
      auVar74 = auVar76._0_16_;
      auVar71 = auVar73._0_16_;
      uVar21 = uVar21 + 1;
    } while (uVar21 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_118;
    aVar84 = auVar85._0_16_;
    aVar55 = auVar56._0_16_;
    aVar80 = auVar81._0_16_;
    aVar78 = auVar79._0_16_;
  }
  auVar66 = vmovlhps_avx(auVar71,auVar74);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar64;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar84;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar55;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar80;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar78;
  __return_storage_ptr__->num_time_segments = local_110;
  __return_storage_ptr__->max_num_time_segments = uVar16;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar66._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar66._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar66._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar66._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }